

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

TValue * cpcparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  int iVar1;
  BCLine hashline;
  byte *pbVar2;
  CTState *cts;
  long lVar3;
  undefined1 uVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  CTypeID CVar8;
  CPToken CVar9;
  CPscl CVar10;
  CTypeID id;
  ulong uVar11;
  ErrMsg em;
  long lVar12;
  int iVar13;
  CType *ct;
  CPDecl decl;
  CType *local_6c8;
  int local_6bc;
  CType *local_6b8;
  CPDecl local_6b0;
  
  *(undefined4 *)((long)L->cframe + 0x14) = 0xffffffff;
  *(undefined8 *)((long)ud + 0x58) = 1;
  *(undefined1 *)((long)ud + 0x6f) = 0;
  *(undefined1 *)((long)ud + 0x68) = 0xff;
  *(undefined4 *)((long)ud + 0x34) = *(undefined4 *)((long)ud + 0x38);
  *(undefined8 *)((long)ud + 0x28) = 0;
  *(undefined4 *)((long)ud + 0x30) = 0;
  pbVar2 = *(byte **)((long)ud + 0x20);
  *(byte **)((long)ud + 0x20) = pbVar2 + 1;
  uVar7 = (uint)*pbVar2;
  *(uint *)ud = uVar7;
  if (uVar7 == 0x5c) {
    cp_get_bs((CPState *)ud);
  }
  *(undefined4 *)((long)ud + 4) = 0;
  *(undefined4 *)((long)ud + 0x60) = 0x38c0;
  cp_next((CPState *)ud);
  if ((*(byte *)((long)ud + 100) & 1) == 0) {
    cp_decl_spec((CPState *)ud,&local_6b0,0);
    cp_declarator((CPState *)ud,&local_6b0);
    CVar8 = cp_decl_intern((CPState *)ud,&local_6b0);
    *(CTypeID *)((long)ud + 0xc) = CVar8;
    if (*(int *)((long)ud + 4) != 0x103) {
      cp_err_token((CPState *)ud,0x103);
    }
  }
  else {
    iVar13 = 1;
    do {
      iVar1 = *(int *)((long)ud + 4);
      if (iVar1 == 0x103) break;
      if (iVar1 == 0x23) {
        hashline = *(BCLine *)((long)ud + 0x58);
        CVar9 = cp_next((CPState *)ud);
        if (CVar9 == 0x100) {
          lVar3 = *(long *)((long)ud + 0x10);
          if (*(int *)(lVar3 + 0xc) != 6) {
            if ((*(int *)(lVar3 + 0xc) == 4) && (*(int *)(lVar3 + 0x10) == 0x656e696c)) {
              CVar9 = cp_next((CPState *)ud);
              if (CVar9 != 0x102) {
                cp_err_token((CPState *)ud,0x100);
              }
              goto LAB_00152588;
            }
            goto LAB_00152944;
          }
          if (*(short *)(lVar3 + 0x14) != 0x616d || *(int *)(lVar3 + 0x10) != 0x67617270)
          goto LAB_00152944;
          cp_next((CPState *)ud);
          if (*(int *)((long)ud + 4) == 0x103) {
LAB_00152592:
            bVar5 = false;
            goto LAB_00152793;
          }
          if (((*(int *)((long)ud + 4) != 0x100) ||
              (*(int *)(*(long *)((long)ud + 0x10) + 0xc) != 4)) ||
             (*(int *)(*(long *)((long)ud + 0x10) + 0x10) != 0x6b636170)) {
            do {
              if (*(int *)((long)ud + 0x58) != hashline) break;
              cp_next((CPState *)ud);
            } while (*(int *)((long)ud + 4) != 0x103);
            goto LAB_00152592;
          }
          cp_next((CPState *)ud);
          cp_check((CPState *)ud,0x28);
          if (*(int *)((long)ud + 4) != 0x100) {
LAB_001528f8:
            if (*(int *)((long)ud + 4) == 0x102) {
              uVar7 = *(uint *)((long)ud + 8);
              iVar1 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> iVar1 == 0; iVar1 = iVar1 + -1) {
                }
              }
              uVar4 = (undefined1)iVar1;
              if (uVar7 == 0) {
                uVar4 = 0;
              }
              *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x6f) + 0x68) = uVar4;
              cp_next((CPState *)ud);
            }
            else {
              *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x6f) + 0x68) = 0xff;
            }
LAB_00152925:
            cp_check((CPState *)ud,0x29);
            goto LAB_00152592;
          }
          lVar3 = *(long *)((long)ud + 0x10);
          CVar9 = 0x100;
          if (*(int *)(lVar3 + 0xc) == 3) {
            if (*(char *)(lVar3 + 0x12) == 'p' && *(short *)(lVar3 + 0x10) == 0x6f70) {
              if (*(char *)((long)ud + 0x6f) != '\0') {
                cVar6 = *(char *)((long)ud + 0x6f) + -1;
                goto LAB_001528df;
              }
              goto LAB_001528e2;
            }
          }
          else if ((*(int *)(lVar3 + 0xc) == 4) && (*(int *)(lVar3 + 0x10) == 0x68737570)) {
            uVar11 = (ulong)*(byte *)((long)ud + 0x6f);
            if (5 < uVar11) {
              CVar9 = 0x100;
              em = LJ_ERR_XLEVELS;
              goto LAB_0015294f;
            }
            *(undefined1 *)((long)ud + uVar11 + 0x69) = *(undefined1 *)((long)ud + uVar11 + 0x68);
            cVar6 = *(char *)((long)ud + 0x6f) + '\x01';
LAB_001528df:
            *(char *)((long)ud + 0x6f) = cVar6;
LAB_001528e2:
            cp_next((CPState *)ud);
            if (*(int *)((long)ud + 4) == 0x2c) {
              cp_next((CPState *)ud);
              goto LAB_001528f8;
            }
            goto LAB_00152925;
          }
        }
        else {
          if (CVar9 == 0x102) {
LAB_00152588:
            cp_line((CPState *)ud,hashline);
            goto LAB_00152592;
          }
LAB_00152944:
          CVar9 = *(CPToken *)((long)ud + 4);
        }
        em = LJ_ERR_XSYMBOL;
LAB_0015294f:
        cp_errmsg((CPState *)ud,CVar9,em);
      }
      if (iVar1 == 0x3b) {
        cp_next((CPState *)ud);
LAB_0015278e:
        bVar5 = false;
        iVar13 = 0;
      }
      else {
        local_6bc = iVar13;
        CVar10 = cp_decl_spec((CPState *)ud,&local_6b0,0x38000);
        if (((*(int *)((long)ud + 4) != 0x103) && (*(int *)((long)ud + 4) != 0x3b)) ||
           (((local_6b0.stack[0].info & 0xf0000000) != 0x70000000 ||
            (((*(uint *)(**(long **)((long)ud + 0x40) +
                        (ulong)(ushort)local_6b0.stack[0].info * 0x10) >> 0x1c) - 1 & 0xfffffffb) !=
             0)))) {
          do {
            cp_declarator((CPState *)ud,&local_6b0);
            CVar8 = cp_decl_intern((CPState *)ud,&local_6b0);
            if ((local_6b0.name != (GCstr *)0x0) && (local_6b0.nameid == 0)) {
              cts = *(CTState **)((long)ud + 0x40);
              if ((short)CVar10 < 0) {
                id = lj_ctype_new(cts,&local_6c8);
                local_6c8->info = CVar8 + 0x70000000;
              }
              else {
                if ((cts->tab[CVar8].info & 0xf0000000) == 0x60000000) {
                  local_6c8 = cts->tab + CVar8;
                  id = CVar8;
                }
                else {
                  if ((CVar10 >> 0x11 & 1) != 0) {
                    id = cp_decl_constinit((CPState *)ud,&local_6c8,CVar8);
                    goto LAB_001526f2;
                  }
                  id = lj_ctype_new(cts,&local_6c8);
                  local_6c8->info = CVar8 + 0xc0000000;
                }
                if (local_6b0.redir != (GCstr *)0x0) {
                  CVar8 = lj_ctype_new(*(CTState **)((long)ud + 0x40),&local_6b8);
                  lVar3 = **(long **)((long)ud + 0x40);
                  lVar12 = (ulong)id * 0x10;
                  local_6c8 = (CType *)(lVar3 + lVar12);
                  local_6b8->info = 0x80040000;
                  local_6b8->sib = *(CTypeID1 *)(lVar3 + 8 + lVar12);
                  *(short *)(lVar3 + 8 + lVar12) = (short)CVar8;
                  (local_6b0.redir)->marked = (local_6b0.redir)->marked | 0x20;
                  (local_6b8->name).gcptr32 = (uint32_t)local_6b0.redir;
                }
              }
LAB_001526f2:
              (local_6b0.name)->marked = (local_6b0.name)->marked | 0x20;
              (local_6c8->name).gcptr32 = (uint32_t)local_6b0.name;
              lj_ctype_addname(*(CTState **)((long)ud + 0x40),local_6c8,id);
            }
            if (*(int *)((long)ud + 4) != 0x2c) break;
            cp_next((CPState *)ud);
            local_6b0.pos = local_6b0.specpos;
            local_6b0.top = local_6b0.specpos + 1;
            local_6b0.stack[local_6b0.specpos].next = 0;
            local_6b0.name = (GCstr *)0x0;
            local_6b0.redir = (GCstr *)0x0;
          } while( true );
        }
        if (*(int *)((long)ud + 4) != 0x103 || local_6bc == 0) {
          cp_check((CPState *)ud,0x3b);
          goto LAB_0015278e;
        }
        iVar13 = 1;
        bVar5 = true;
      }
LAB_00152793:
    } while (!bVar5);
  }
  if ((*(long *)((long)ud + 0x48) != 0) &&
     (*(long *)((long)ud + 0x48) != *(long *)(*(long *)((long)ud + 0x38) + 0x18))) {
    cp_err((CPState *)ud,LJ_ERR_FFI_NUMPARAM);
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpcparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  CPState *cp = (CPState *)ud;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  cp_init(cp);
  if ((cp->mode & CPARSE_MODE_MULTI))
    cp_decl_multi(cp);
  else
    cp_decl_single(cp);
  if (cp->param && cp->param != cp->L->top)
    cp_err(cp, LJ_ERR_FFI_NUMPARAM);
  lj_assertCP(cp->depth == 0, "unbalanced cparser declaration depth");
  return NULL;
}